

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_base.hpp
# Opt level: O0

bool __thiscall
boost::spirit::qi::
sequence_base<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::equal_to,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::a...oto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>,boost::fusion::nil_>>>
::
parse_impl<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type_const>
          (sequence_base<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::equal_to,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::a___oto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>_boost__fusion__nil_>>>
           *this,store<0UL,_const_boost::spirit::unused_type_&> *first,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *last,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *context,unused_type *skipper,unused_type *attr_)

{
  bool bVar1;
  fail_function<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_const_boost::spirit::unused_type,_boost::spirit::unused_type>
  local_70;
  vector<boost::spirit::unused_type_const&> local_50 [8];
  type attr_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  iter;
  unused_type *attr__local;
  unused_type *skipper_local;
  unused_type *context_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *last_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *first_local;
  sequence_base<_12b1ca33_> *this_local;
  
  attr_local.
  super_vector_data<boost::fusion::detail::index_sequence<0UL>,_const_boost::spirit::unused_type_&>.
  super_store<0UL,_const_boost::spirit::unused_type_&>.elem =
       (vector_data<boost::fusion::detail::index_sequence<0UL>,_const_boost::spirit::unused_type_&>)
       first->elem;
  fusion::vector<boost::spirit::unused_type_const&>::vector<boost::spirit::unused_type_const&>
            (local_50,attr_);
  sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::equal_to,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>,boost::fusion::nil_>>>
  ::
  fail_function<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type>
            (&local_70,
             (sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::equal_to,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>,boost::fusion::nil_>>>
              *)&attr_local,last,context,skipper,attr_);
  bVar1 = any_if<boost::spirit::traits::attribute_not_unused<boost::spirit::unused_type_const,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::equal_to,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>,boost::fusion::nil_>>,boost::fusion::vector<boost::spirit::unused_type_const&>,boost::spirit::qi::detail::fail_function<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type>>
                    (this,local_50);
  if (!bVar1) {
    first->elem = (unused_type *)
                  attr_local.
                  super_vector_data<boost::fusion::detail::index_sequence<0UL>,_const_boost::spirit::unused_type_&>
                  .super_store<0UL,_const_boost::spirit::unused_type_&>.elem;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool parse_impl(Iterator& first, Iterator const& last
          , Context& context, Skipper const& skipper
          , Attribute& attr_, mpl::false_) const
        {
            Iterator iter = first;
            typedef traits::attribute_not_unused<Context, Iterator> predicate;

            // wrap the attribute in a tuple if it is not a tuple or if the 
            // attribute of this sequence is a single element tuple
            typedef typename attribute<Context, Iterator>::type_ attr_type_;
            typename traits::wrap_if_not_tuple<Attribute
              , typename mpl::and_<
                    traits::one_element_sequence<attr_type_>
                  , mpl::not_<traits::one_element_sequence<Attribute> >
                >::type
            >::type attr_local(attr_);

            // return false if *any* of the parsers fail
            if (spirit::any_if(elements, attr_local
              , Derived::fail_function(iter, last, context, skipper), predicate()))
                return false;
            first = iter;
            return true;
        }